

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O3

void __thiscall absl::lts_20250127::Cord::Cord(Cord *this,Cord *src)

{
  CordRep *pCVar1;
  bool bVar2;
  
  pCVar1 = (src->contents_).data_.rep_.field_0.as_tree.rep;
  if (pCVar1 == (CordRep *)0x0 || ((src->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    pCVar1 = (src->contents_).data_.rep_.field_0.as_tree.rep;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
         (src->contents_).data_.rep_.field_0.as_tree.cordz_info;
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar1;
  }
  else {
    LOCK();
    (pCVar1->refcount).count_.super___atomic_base<int>._M_i =
         (pCVar1->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar1;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    bVar2 = cord_internal::InlineData::is_either_profiled((InlineData *)this,(InlineData *)src);
    if (bVar2) {
      cord_internal::CordzInfo::MaybeTrackCordImpl
                ((InlineData *)this,(InlineData *)src,kConstructorCord);
      return;
    }
  }
  return;
}

Assistant:

inline Cord::Cord(const Cord& src) : contents_(src.contents_) {}